

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void __thiscall
wasm::Random::Random(Random *this,vector<char,_std::allocator<char>_> *bytes_,FeatureSet features)

{
  pointer pcVar1;
  char local_19;
  
  pcVar1 = (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar1;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (bytes_->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->pos = 0;
  this->finishedInput = false;
  this->xorFactor = 0;
  (this->features).features = features.features;
  if ((this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_19 = '\0';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->bytes,&local_19);
  }
  return;
}

Assistant:

Random::Random(std::vector<char>&& bytes_, FeatureSet features)
  : bytes(std::move(bytes_)), features(features) {
  // Ensure there is *some* input to be read.
  if (bytes.empty()) {
    bytes.push_back(0);
  }
}